

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-use.c
# Opt level: O1

_Bool borg_eat(wchar_t tval,wchar_t sval)

{
  wchar_t wVar1;
  char *what;
  
  wVar1 = borg_slot(tval,sval);
  if (L'\xffffffff' < wVar1) {
    what = format("# Eating %s.",borg_items + (uint)wVar1);
    borg_note(what);
    borg_keypress(0x45);
    borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[(uint)wVar1]);
    borg.goal.item = -1;
    borg.goal.shop = -1;
    borg.goal.ware = -1;
  }
  return L'\xffffffff' < wVar1;
}

Assistant:

bool borg_eat(int tval, int sval)
{
    int i;

    /* Look for that food */
    i = borg_slot(tval, sval);

    /* None available */
    if (i < 0)
        return false;

    /* Log the message */
    borg_note(format("# Eating %s.", borg_items[i].desc));

    /* Perform the action */
    borg_keypress('E');
    borg_keypress(all_letters_nohjkl[i]);

    /* Hack -- Clear "shop" goals */
    borg.goal.shop = borg.goal.ware = borg.goal.item = -1;

    /* Success */
    return true;
}